

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolorspace.cpp
# Opt level: O2

QDataStream * operator>>(QDataStream *s,QColorSpace *colorSpace)

{
  QExplicitlySharedDataPointer<QColorSpacePrivate> QVar1;
  long in_FS_OFFSET;
  QExplicitlySharedDataPointer<QColorSpacePrivate> local_50;
  QArrayDataPointer<char> local_48;
  QExplicitlySharedDataPointer<QColorSpacePrivate> local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d = (Data *)0x0;
  local_48.ptr = (char *)0x0;
  local_48.size = 0;
  operator>>(s,(QByteArray *)&local_48);
  QColorSpace::fromIccProfile((QColorSpace *)&local_50,(QByteArray *)&local_48);
  QVar1.d.ptr = local_50.d.ptr;
  local_50.d.ptr = (totally_ordered_wrapper<QColorSpacePrivate_*>)(QColorSpacePrivate *)0x0;
  local_30.d.ptr = (totally_ordered_wrapper<QColorSpacePrivate_*>)(colorSpace->d_ptr).d.ptr;
  (colorSpace->d_ptr).d.ptr = (QColorSpacePrivate *)QVar1.d.ptr;
  QColorSpace::~QColorSpace((QColorSpace *)&local_30);
  QColorSpace::~QColorSpace((QColorSpace *)&local_50);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return s;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &s, QColorSpace &colorSpace)
{
    QByteArray iccProfile;
    s >> iccProfile;
    colorSpace = QColorSpace::fromIccProfile(iccProfile);
    return s;
}